

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

int __thiscall capnp::TwoPartyServer::listen(TwoPartyServer *this,int __fd,int __n)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000014;
  Disposer *pDVar2;
  undefined4 in_register_00000034;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  pDVar2 = (Disposer *)CONCAT44(in_register_00000014,__n);
  (**pDVar2->_vptr_Disposer)(&local_60,pDVar2);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_60,
             kj::_::
             TransformPromiseNode<kj::Promise<void>,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty.c++:183:13),_kj::_::PropagateException>
             ::anon_class_16_2_8321eaef_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006721e8;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)CONCAT44(in_register_00000034,__fd)
  ;
  this_00[1].dependency.disposer = pDVar2;
  intermediate.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::Own<kj::AsyncIoStream>,capnp::TwoPartyServer::listen(kj::ConnectionReceiver&)::$_0,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)this_00;
  kj::_::maybeChain<void>(&local_40,(Promise<void> *)&intermediate);
  pPVar1 = local_40.ptr;
  local_30.disposer = local_40.disposer;
  local_40.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode>::dispose(&local_40);
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_40.disposer;
  (this->bootstrapInterface).hook.disposer = (Disposer *)pPVar1;
  local_30.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode>::dispose(&local_30);
  kj::Own<kj::_::PromiseNode>::dispose(&intermediate);
  kj::Own<kj::_::PromiseNode>::dispose(&local_60);
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::listen(kj::ConnectionReceiver& listener) {
  return listener.accept()
      .then([this,&listener](kj::Own<kj::AsyncIoStream>&& connection) mutable {
    accept(kj::mv(connection));
    return listen(listener);
  });
}